

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweep.cpp
# Opt level: O2

void __thiscall
Memory::RecyclerSweep::
MergePendingNewMediumHeapBlockList<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>
          (RecyclerSweep *this)

{
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *list;
  
  list = (this->mediumNormalData).pendingMergeNewHeapBlockList;
  (this->mediumNormalData).pendingMergeNewHeapBlockList =
       (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
  HeapBlockList::
  ForEachEditing<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>,Memory::RecyclerSweep::MergePendingNewMediumHeapBlockList<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>()::_lambda(Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            (list,(anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

void
RecyclerSweep::MergePendingNewMediumHeapBlockList()
{
    TBlockType *& blockList = this->GetData<TBlockType>().pendingMergeNewHeapBlockList;
    TBlockType * list = blockList;
    blockList = nullptr;
    HeapBlockList::ForEachEditing(list, [this](TBlockType * heapBlock)
    {
        auto& bucket = this->heapInfo->GetMediumBucket<TBlockType::RequiredAttributes>(heapBlock->GetObjectSize());
        bucket.MergeNewHeapBlock(heapBlock);
    });
}